

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.c
# Opt level: O0

void net_param_save_imp(net_t *n,FILE *fp)

{
  layer *plVar1;
  int iVar2;
  int local_2c;
  int j;
  branch_layer_t *me;
  int i;
  FILE *fp_local;
  net_t *n_local;
  
  for (me._4_4_ = 0; me._4_4_ < n->size; me._4_4_ = me._4_4_ + 1) {
    iVar2 = is_branch_layer(n->layer[me._4_4_]);
    if (iVar2 == 0) {
      data_save(&n->layer[me._4_4_]->weight,fp);
      data_save(&n->layer[me._4_4_]->bias,fp);
    }
    else {
      plVar1 = n->layer[me._4_4_];
      for (local_2c = 0; local_2c < *(int *)&plVar1[1].func; local_2c = local_2c + 1) {
        net_param_save_imp(*(net_t **)(plVar1[1].in.val + (long)local_2c * 4 + 2),fp);
      }
    }
  }
  return;
}

Assistant:

static void net_param_save_imp(net_t *n, FILE *fp)
{
	for (int i = 0; i < n->size; ++i)
	{
		if (!is_branch_layer(n->layer[i]))
		{	
			data_save(&n->layer[i]->weight, fp);
			data_save(&n->layer[i]->bias, fp);
		} else {
			branch_layer_t *me = (branch_layer_t *)n->layer[i];
			for (int j = 0; j < me->num; ++j)
			{
				net_param_save_imp(me->branch[j].n, fp);
			}
		}
	}
}